

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O3

void __thiscall agge::tests::DashTests::SegmentAreOutputtedAsIsIfDashIsLong(DashTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FailedAssertion *pFVar3;
  long lVar4;
  point reference2 [4];
  dash d;
  undefined1 local_1b8 [8];
  int local_1b0;
  undefined8 local_1ac;
  undefined4 local_1a4;
  undefined8 local_1a0;
  int local_198;
  pointer local_194;
  int local_18c;
  undefined1 local_188 [8];
  undefined4 uStack_180;
  undefined4 uStack_17c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  LocationInfo local_150;
  point local_128;
  undefined4 local_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  undefined4 local_108;
  pointer local_f8;
  int local_f0;
  pointer local_ec;
  int local_e4;
  pointer local_e0;
  int local_d8;
  dash local_c8;
  string local_70;
  string local_50;
  
  dash::dash(&local_c8);
  dash::add_dash(&local_c8,6.0,1.0);
  dash::add_vertex(&local_c8,1.1,17.0,1);
  dash::add_vertex(&local_c8,4.1,13.0,2);
  local_1b0 = 0;
  local_1b8 = (undefined1  [8])0x0;
  local_f0 = dash::vertex(&local_c8,(real_t *)local_1b8,(real_t *)(local_1b8 + 4));
  local_f8 = (pointer)local_1b8;
  local_1b0 = 0;
  local_1b8 = (undefined1  [8])0x0;
  local_e4 = dash::vertex(&local_c8,(real_t *)local_1b8,(real_t *)(local_1b8 + 4));
  local_ec = (pointer)local_1b8;
  local_1b0 = 0;
  local_1b8 = (undefined1  [8])0x0;
  local_d8 = dash::vertex(&local_c8,(real_t *)local_1b8,(real_t *)(local_1b8 + 4));
  local_e0 = (pointer)local_1b8;
  uStack_110 = 0;
  local_108 = 0;
  local_128.x = 1.1;
  local_128.y = 17.0;
  local_128.command = 1;
  local_11c = 0x40833333;
  uStack_118 = 0x41500000;
  uStack_114 = 2;
  paVar1 = &local_150.filename.field_2;
  local_150.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1b8,&local_150.filename,0x21);
  lVar4 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_128.x + lVar4),(point *)((long)&local_f8 + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_188 = (undefined1  [8])&local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_188,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,(string *)local_188,(LocationInfo *)local_1b8);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x24);
  if (local_1b8 != (undefined1  [8])((long)&local_1ac + 4)) {
    operator_delete((void *)local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.filename._M_dataplus._M_p);
  }
  dash::remove_all(&local_c8);
  dash::add_vertex(&local_c8,1.0,1.0,1);
  dash::add_vertex(&local_c8,2.5,3.0,2);
  dash::add_vertex(&local_c8,2.7,3.1,2);
  uStack_180 = 0;
  local_188 = (undefined1  [8])0x0;
  local_1b0 = dash::vertex(&local_c8,(real_t *)local_188,(real_t *)(local_188 + 4));
  local_1b8 = local_188;
  uStack_180 = 0;
  local_188 = (undefined1  [8])0x0;
  local_1a4 = dash::vertex(&local_c8,(real_t *)local_188,(real_t *)(local_188 + 4));
  local_1ac = (pointer)local_188;
  uStack_180 = 0;
  local_188 = (undefined1  [8])0x0;
  local_198 = dash::vertex(&local_c8,(real_t *)local_188,(real_t *)(local_188 + 4));
  local_1a0 = local_188;
  uStack_180 = 0;
  local_188 = (undefined1  [8])0x0;
  local_18c = dash::vertex(&local_c8,(real_t *)local_188,(real_t *)(local_188 + 4));
  local_194 = (pointer)local_188;
  local_168 = 2;
  uStack_160 = 0;
  local_178._M_allocated_capacity = 0x240400000;
  local_178._8_8_ = 0x40466666402ccccd;
  local_188 = (undefined1  [8])0x3f8000003f800000;
  uStack_180 = 1;
  uStack_17c = 0x40200000;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_150,&local_70,0x32);
  lVar4 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)(local_188 + lVar4),(point *)(local_1b8 + lVar4));
    if (!bVar2) {
      pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar3,&local_50,&local_150);
      __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0x30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_150.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_c8._pattern._begin != (dash_gap *)0x0) {
    operator_delete__(local_c8._pattern._begin);
  }
  if (local_c8.super_vertex_sequence.super_pod_vector<agge::vertex>._begin != (vertex *)0x0) {
    operator_delete__(local_c8.super_vertex_sequence.super_pod_vector<agge::vertex>._begin);
  }
  return;
}

Assistant:

test( SegmentAreOutputtedAsIsIfDashIsLong )
			{
				// INIT
				dash d;

				// INIT / ACT
				d.add_dash(6.0f, 1.0f);

				// ACT
				move_to(d, 1.1f, 17.0f);
				line_to(d, 4.1f, 13.0f);
				mocks::path::point result1[] = { vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference1[] = {
					{ 1.1f, 17.0f, path_command_move_to },
					{ 4.1f, 13.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// ACT
				d.remove_all();
				move_to(d, 1.0f, 1.0f);
				line_to(d, 2.5f, 3.0f);
				line_to(d, 2.7f, 3.1f);
				mocks::path::point result2[] = { vertex(d), vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference2[] = {
					{ 1.0f, 1.0f, path_command_move_to },
					{ 2.5f, 3.0f, path_command_line_to },
					{ 2.7f, 3.1f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}